

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<32U,_2U,_buffer_layout_bfs>::operator()
          (fill<32U,_2U,_buffer_layout_bfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  uchar *puVar1;
  long lVar2;
  uchar **ppuVar3;
  int iVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  uchar **ppuVar10;
  long lVar11;
  long lVar12;
  size_t __n;
  uchar **begin;
  size_t n0;
  fill<32U,_4U,_buffer_layout_bfs> local_5c;
  fill<32U,_5U,_buffer_layout_bfs> local_5b;
  fill<32U,_5U,_buffer_layout_bfs> local_5a;
  fill<32U,_4U,_buffer_layout_bfs> local_59;
  array<Stream,_32UL> *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  uchar **local_40;
  uchar **local_38;
  
  puVar9 = buffer_count->_M_elems + 4;
  puVar8 = buffer_count->_M_elems + 5;
  local_38 = buffer + 0x10;
  local_40 = buffer + 0x27;
  lVar11 = 0;
  n0 = 0;
  local_58 = streams;
  local_50 = puVar8;
  local_48 = puVar9;
  do {
    uVar6 = *puVar9;
    if (uVar6 == 0) {
      fill<32U,_4U,_buffer_layout_bfs>::operator()(&local_59,local_58,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[4];
      puVar8 = local_50;
      if (uVar6 == 0) {
        uVar6 = *local_50;
        lVar11 = -0x40 - lVar11;
        lVar12 = 8 - n0;
        puVar9 = local_50;
        break;
      }
    }
    uVar7 = *puVar8;
    if (uVar7 == 0) {
      fill<32U,_5U,_buffer_layout_bfs>::operator()(&local_5a,local_58,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[4];
      uVar7 = buffer_count->_M_elems[5];
      puVar8 = local_50;
      if (uVar7 == 0) {
        __n = -lVar11;
        lVar11 = -n0;
        puVar9 = local_48;
        goto LAB_001310b5;
      }
    }
    ppuVar10 = local_38 + -uVar6 + 0x17;
    ppuVar3 = local_40 + -uVar7 + 0x17;
    iVar4 = cmp(buffer[-uVar6 + 0x27],buffer[-uVar7 + 0x3e]);
    puVar9 = local_48;
    puVar5 = puVar8;
    if (iVar4 < 1) {
      puVar5 = local_48;
      ppuVar3 = ppuVar10;
    }
    puVar1 = *ppuVar3;
    *puVar5 = *puVar5 - 1;
    buffer[n0] = puVar1;
    check_input(buffer,n0);
    n0 = n0 + 1;
    lVar11 = lVar11 + -8;
    if (n0 == 8) {
      buffer_count->_M_elems[2] = 8;
      return;
    }
  } while( true );
  do {
    if (uVar6 == 0) {
      fill<32U,_5U,_buffer_layout_bfs>::operator()(&local_5b,local_58,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[5];
      puVar9 = local_50;
      if (uVar6 == 0) {
        lVar2 = -lVar11;
        __n = lVar11 + 0x40;
        goto LAB_00131142;
      }
    }
    buffer[n0] = buffer[0x3e - uVar6];
    uVar6 = uVar6 - 1;
    *puVar9 = uVar6;
    lVar12 = lVar12 + -1;
    n0 = n0 + 1;
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0);
  goto LAB_00131100;
LAB_001310b5:
  do {
    if (uVar6 == 0) {
      fill<32U,_4U,_buffer_layout_bfs>::operator()(&local_5c,local_58,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[4];
      puVar9 = local_48;
      if (uVar6 == 0) {
        lVar2 = 0x40 - __n;
        lVar12 = lVar11 + 8;
        n0 = -lVar11;
LAB_00131142:
        ppuVar10 = (uchar **)((long)buffer + lVar2);
        memmove(buffer + lVar12,buffer,__n);
        buffer_count->_M_elems[2] = n0;
        goto LAB_00131155;
      }
    }
    *(uchar **)((long)buffer + __n) = buffer[0x27 - uVar6];
    uVar6 = uVar6 - 1;
    *puVar9 = uVar6;
    lVar11 = lVar11 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
LAB_00131100:
  buffer_count->_M_elems[2] = 8;
  n0 = 8;
  ppuVar10 = buffer;
LAB_00131155:
  check_input(ppuVar10,n0);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}